

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O2

bool __thiscall inja::Parser::parse_expression_and(Parser *this,Template *tmpl)

{
  basic_string_view<char,_std::char_traits<char>_> lhs;
  bool bVar1;
  type rhs;
  
  bVar1 = parse_expression_not(this,tmpl);
  if (bVar1) {
    if ((this->m_tok).kind != Id) {
      return true;
    }
    lhs.data_ = (this->m_tok).text.data_;
    lhs.size_ = (this->m_tok).text.size_;
    rhs.size_ = 3;
    rhs.data_ = "and";
    bVar1 = nonstd::sv_lite::operator!=(lhs,rhs);
    if (bVar1) {
      return true;
    }
    get_next_token(this);
    bVar1 = parse_expression_not(this,tmpl);
    if (bVar1) {
      append_function(this,tmpl,And,2);
      return true;
    }
  }
  return false;
}

Assistant:

bool parse_expression_and(Template& tmpl) {
		if (!parse_expression_not(tmpl)) return false;
		if (m_tok.kind != Token::Kind::Id || m_tok.text != "and") return true;
		get_next_token();
		if (!parse_expression_not(tmpl)) return false;
		append_function(tmpl, Bytecode::Op::And, 2);
		return true;
	}